

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

int fy_fetch_plain_scalar(fy_parser *fyp,int c)

{
  fy_token **end_mark;
  byte bVar1;
  fy_error_type fVar2;
  undefined4 uVar3;
  _Bool _Var4;
  int iVar5;
  int c_00;
  int iVar6;
  int iVar7;
  fy_atom *pfVar8;
  void *pvVar9;
  long lVar10;
  fy_token *fyt;
  bool bVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  fy_diag_report_ctx *fydrc;
  size_t offset;
  bool bVar16;
  undefined1 local_148 [48];
  char *apcStack_118 [2];
  undefined1 auStack_108 [8];
  fy_diag_report_ctx _drc_1;
  undefined1 auStack_d8 [8];
  fy_simple_key_mark skm;
  void *local_a0;
  undefined1 auStack_98 [8];
  fy_mark last_mark;
  fy_diag_report_ctx _drc;
  int local_4c;
  char *local_48;
  
  if ((c == 9) && (fyp->state == FYPS_BLOCK_MAPPING_VALUE)) {
    fydrc = (fy_diag_report_ctx *)&last_mark.line;
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    last_mark.line = 4;
    last_mark.column = 2;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "invalid tab as indendation in a mapping";
    goto LAB_0013475c;
  }
  if (fyp != (fy_parser *)0x0) {
    bVar1 = 1;
    if (c < 0xd) {
      if (c != 9) {
        if (c != 10) {
LAB_001346d2:
          if (((fyp->current_input != (fy_input *)0x0) &&
              ((fyp->current_input->field_0x74 & 1) != 0)) || ((1 < c - 0x2028U && (c != 0x85)))) {
            bVar1 = 0;
          }
        }
LAB_001346f4:
        if ((bool)(0 < c & (bVar1 ^ 1))) goto LAB_00134768;
      }
    }
    else {
      if (c == 0xd) goto LAB_001346f4;
      if (c != 0x20) goto LAB_001346d2;
    }
    fydrc = (fy_diag_report_ctx *)&last_mark.line;
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    last_mark.line = 4;
    last_mark.column = 2;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "plain scalar cannot start with blank or zero";
    goto LAB_0013475c;
  }
LAB_00134768:
  if (c < 0) {
    pvVar9 = (void *)0x0;
  }
  else if (c < 0x80) {
    apcStack_118[1] = (char *)0x134787;
    pvVar9 = memchr(",[]{}#&*!|>\'\"%@`",c,0x11);
  }
  else {
    apcStack_118[1] = (char *)0x13479a;
    pvVar9 = fy_utf8_memchr_generic(",[]{}#&*!|>\'\"%@`",c,0x10);
  }
  if (pvVar9 != (void *)0x0) {
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    last_mark.line = 4;
    last_mark.column = 2;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "plain scalar cannot start with \'%c\'";
LAB_001347f5:
    uVar14 = (ulong)(uint)c;
LAB_001347fe:
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&last_mark.line,pcVar15,uVar14);
    return -1;
  }
  if (c == 0x2d) {
    apcStack_118[1] = (char *)0x134830;
    iVar5 = fy_parse_peek_at_offset(fyp,1);
    if ((iVar5 == 0x20) || (iVar5 == 9)) {
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      last_mark.line = 4;
      last_mark.column = 2;
      pfVar8 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_148);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar15 = "plain scalar cannot start with \'%c\' followed by blank";
      uVar14 = 0x2d;
      goto LAB_001347fe;
    }
  }
  if ((fyp->flow_level == 0) && ((c == 0x3f || (c == 0x3a)))) {
    apcStack_118[1] = (char *)0x134900;
    iVar5 = fy_parse_peek_at_offset(fyp,1);
    if ((iVar5 == 0x20) || (iVar5 == 9)) {
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      last_mark.line = 4;
      last_mark.column = 2;
      pfVar8 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_148);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar15 = "plain scalar cannot start with \'%c\' followed by blank (in block context)";
      goto LAB_001347f5;
    }
  }
  skm.mark.column = fyp->flow_level;
  if ((skm.mark.column != 0) && (fyp->column <= fyp->indent)) {
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    last_mark.line = 4;
    last_mark.column = 2;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "mapping";
    if (fyp->flow == FYFT_SEQUENCE) {
      pcVar15 = "sequence";
    }
    fy_parser_diag_report
              (fyp,(fy_diag_report_ctx *)&last_mark.line,"wrongly indented flow %s",pcVar15);
    return -1;
  }
  if (fyp == (fy_parser *)0x0) {
    auStack_d8 = (undefined1  [8])0x0;
    skm.mark.input_pos = 0;
  }
  else {
    auStack_d8 = (undefined1  [8])fyp->current_input_pos;
    skm.mark.input_pos._0_4_ = fyp->line;
    skm.mark.input_pos._4_4_ = fyp->column;
  }
  iVar5 = 0;
  skm.mark.line._0_1_ = false;
  if (skm.mark.column == 0) {
    skm.mark.line._0_1_ = fyp->indent == fyp->column;
  }
  apcStack_118[1] = (char *)0x134a20;
  fy_fill_atom_start(fyp,(fy_atom *)&last_mark.line);
  iVar7 = fyp->indent;
  auStack_98 = (undefined1  [8])0x0;
  last_mark.input_pos = 0;
  c_00 = -1;
  local_a0 = (void *)0x0;
  bVar11 = false;
  bVar16 = false;
  iVar13 = 0;
  local_48 = (char *)0x0;
LAB_00134a7b:
  if (fyp->column == 0) {
    pcVar15 = (char *)fyp->current_ptr;
    if ((pcVar15 == (char *)0x0) || (fyp->current_left < 3)) {
      apcStack_118[1] = (char *)0x134d48;
      pcVar15 = (char *)fy_ensure_lookahead_slow_path(fyp,3,(size_t *)0x0);
    }
    if (pcVar15 == (char *)0x0) {
LAB_00134d65:
      pcVar15 = (char *)fyp->current_ptr;
      if ((pcVar15 == (char *)0x0) || (fyp->current_left < 3)) {
        apcStack_118[1] = (char *)0x134d84;
        pcVar15 = (char *)fy_ensure_lookahead_slow_path(fyp,3,(size_t *)0x0);
      }
      if (pcVar15 != (char *)0x0) {
        apcStack_118[1] = (char *)0x134da1;
        iVar6 = strncmp(pcVar15,"...",3);
        if (iVar6 == 0) goto LAB_00134da9;
      }
    }
    else {
      apcStack_118[1] = (char *)0x134d61;
      iVar6 = strncmp(pcVar15,"---",3);
      if (iVar6 != 0) goto LAB_00134d65;
LAB_00134da9:
      apcStack_118[1] = (char *)0x134db6;
      iVar6 = fy_parse_peek_at_offset(fyp,3);
      if (fyp != (fy_parser *)0x0) {
        bVar12 = true;
        if (iVar6 < 0xd) {
          if (iVar6 != 10) {
            if (iVar6 == 9) goto LAB_00135026;
LAB_00134f8c:
            if (((fyp->current_input != (fy_input *)0x0) &&
                ((fyp->current_input->field_0x74 & 1) != 0)) ||
               ((1 < iVar6 - 0x2028U && (iVar6 != 0x85)))) {
              bVar12 = false;
            }
          }
        }
        else if (iVar6 != 0xd) {
          if (iVar6 != 0x20) goto LAB_00134f8c;
          goto LAB_00135026;
        }
        if ((iVar6 < 1) || (bVar12)) goto LAB_00135026;
      }
    }
  }
  apcStack_118[1] = (char *)0x134a93;
  c_00 = fy_parse_peek_at_offset(fyp,0);
  if (c_00 != 0x23) {
    local_4c = 0;
    do {
      if (fyp != (fy_parser *)0x0) {
        bVar12 = true;
        if (c_00 < 0xd) {
          if (c_00 != 10) {
            if (c_00 != 9) goto LAB_00134ad8;
            goto LAB_00134ce9;
          }
        }
        else if (c_00 != 0xd) {
          if (c_00 == 0x20) goto LAB_00134ce9;
LAB_00134ad8:
          if (((fyp->current_input != (fy_input *)0x0) &&
              ((fyp->current_input->field_0x74 & 1) != 0)) ||
             ((1 < c_00 - 0x2028U && (c_00 != 0x85)))) {
            bVar12 = false;
          }
        }
        if ((c_00 < 1) || (bVar12)) goto LAB_00134ce9;
      }
      apcStack_118[1] = (char *)0x134b15;
      iVar6 = fy_parse_peek_at_offset(fyp,0);
      if (-1 < iVar6) {
        offset = 1;
        if ((0x7f < iVar6) && (offset = 2, 0x7ff < iVar6)) {
          offset = (ulong)(0xffff < iVar6) + 3;
        }
        apcStack_118[1] = (char *)0x134b51;
        iVar6 = fy_parse_peek_at_offset(fyp,offset);
      }
      if ((fyp != (fy_parser *)0x0) && (c_00 == 0x3a)) {
        bVar12 = true;
        if (iVar6 < 0xd) {
          if (iVar6 != 10) {
            if (iVar6 == 9) goto LAB_00134ce9;
LAB_00134b8c:
            if (((fyp->current_input != (fy_input *)0x0) &&
                ((fyp->current_input->field_0x74 & 1) != 0)) ||
               ((1 < iVar6 - 0x2028U && (iVar6 != 0x85)))) {
              bVar12 = false;
            }
          }
        }
        else if (iVar6 != 0xd) {
          if (iVar6 != 0x20) goto LAB_00134b8c;
          goto LAB_00134ce9;
        }
        if ((iVar6 < 1) || (bVar12)) goto LAB_00134ce9;
      }
      if ((c_00 == 0x3a) && (fyp->flow_level != 0)) {
        if (iVar6 < 0) {
          pvVar9 = (void *)0x0;
        }
        else if (iVar6 < 0x80) {
          apcStack_118[1] = (char *)0x134bea;
          pvVar9 = memchr(",[]{}",iVar6,6);
        }
        else {
          apcStack_118[1] = (char *)0x134c04;
          pvVar9 = fy_utf8_memchr_generic(",[]{}",iVar6,5);
        }
        if (pvVar9 != (void *)0x0) goto LAB_00134ce9;
      }
      if ((fyp->flow_level != 0) &&
         (((c_00 - 0x5bU < 0x23 && ((0x500000005U >> ((ulong)(c_00 - 0x5bU) & 0x3f) & 1) != 0)) ||
          (c_00 == 0x2c)))) goto LAB_00134ce9;
      if (iVar13 == 0) {
        if (iVar5 != 0) goto LAB_00134c65;
      }
      else {
        iVar5 = iVar13 + -1;
        if (iVar13 < 2) {
          iVar5 = 1;
        }
LAB_00134c65:
        local_48 = local_48 + iVar5;
      }
      apcStack_118[1] = (char *)0x134c9a;
      fy_advance(fyp,c_00);
      lVar10 = 1;
      if ((0x7f < c_00) && (lVar10 = 2, 0x7ff < c_00)) {
        lVar10 = (ulong)(0xffff < c_00) + 3;
      }
      local_48 = local_48 + lVar10;
      local_4c = local_4c + -1;
      iVar5 = 0;
      iVar13 = 0;
      c_00 = iVar6;
    } while( true );
  }
  c_00 = 0x23;
LAB_00135026:
  if (local_a0 == (void *)0x0) {
    apcStack_118[1] = (char *)0x135051;
    fy_fill_atom_end(fyp,(fy_atom *)&last_mark.line);
  }
  else {
    apcStack_118[1] = (char *)0x135043;
    fy_fill_atom_end_at(fyp,(fy_atom *)&last_mark.line,(fy_mark *)auStack_98);
  }
  if (c_00 + 3U < 2) {
    fydrc = (fy_diag_report_ctx *)auStack_108;
    _drc_1.type = FYET_DEBUG;
    _drc_1.module = FYEM_UNKNOWN;
    _drc_1.fyt = (fy_token *)0x0;
    _drc_1.has_override = false;
    _drc_1._17_7_ = 0;
    _drc_1.override_file = (char *)0x0;
    auStack_108._0_4_ = FYET_ERROR;
    auStack_108._4_4_ = FYEM_SCAN;
    pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&last_mark.line,(fy_mark *)&_drc.fyt,
                               (fy_atom *)local_148);
    _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "plain scalar is malformed UTF8";
    goto LAB_0013475c;
  }
  fVar2 = _drc.type;
  uVar3 = _drc._16_4_;
  iVar5 = fyp->pending_complex_key_column;
  apcStack_118[1] = (char *)0x135153;
  iVar7 = fy_atom_format_text_length((fy_atom *)&last_mark.line);
  if (local_48 != (char *)(long)iVar7) {
    apcStack_118[1] = (char *)0x135205;
    pcVar15 = fy_atom_data((fy_atom *)&last_mark.line);
    apcStack_118[1] = (char *)0x13521f;
    iVar5 = fy_utf8_format_text_length(pcVar15,(long)_drc.fyt - last_mark._8_8_,fyue_singlequote);
    lVar10 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
    *(undefined8 *)((long)apcStack_118 + lVar10 + 8) = 0x135244;
    pcVar15 = fy_utf8_format_text(pcVar15,(long)_drc.fyt - last_mark._8_8_,auStack_108 + lVar10,
                                  (long)iVar5,fyue_singlequote);
    *(char **)(local_148 + lVar10 + 0x30) = pcVar15;
    *(char **)(local_148 + lVar10 + 0x28) = local_48;
    *(char **)(local_148 + lVar10 + 0x20) = (char *)(long)iVar7;
    *(undefined8 *)(local_148 + lVar10 + 0x18) = 0x13527b;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xd68,"fy_fetch_plain_scalar",
                   "storage hint calculation failed real %zu != hint %zu - \'%s\'");
    return -1;
  }
  end_mark = &_drc.fyt;
  _drc.override_file = local_48;
  if (((fyp != (fy_parser *)0x0) && (fyp->current_input != (fy_input *)0x0)) &&
     ((fyp->current_input->field_0x74 & 1) != 0)) {
    if ((int)uVar3 <= (int)fVar2) {
      apcStack_118[1] = (char *)0x135294;
      iVar7 = fy_atom_strcmp((fy_atom *)&last_mark.line,"false");
      if (iVar7 != 0) {
        apcStack_118[1] = (char *)0x1352a8;
        iVar7 = fy_atom_strcmp((fy_atom *)&last_mark.line,"true");
        if (iVar7 != 0) {
          apcStack_118[1] = (char *)0x1352bc;
          iVar7 = fy_atom_strcmp((fy_atom *)&last_mark.line,"null");
          if (iVar7 != 0) {
            apcStack_118[1] = (char *)0x1352c9;
            _Var4 = fy_atom_is_number((fy_atom *)&last_mark.line);
            if (!_Var4) {
              _drc_1.type = FYET_DEBUG;
              _drc_1.module = FYEM_UNKNOWN;
              _drc_1.fyt = (fy_token *)0x0;
              _drc_1.has_override = false;
              _drc_1._17_7_ = 0;
              _drc_1.override_file = (char *)0x0;
              auStack_108._0_4_ = FYET_ERROR;
              auStack_108._4_4_ = FYEM_SCAN;
              pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&last_mark.line,
                                         (fy_mark *)end_mark,(fy_atom *)local_148);
              _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
              pcVar15 = "Invalid JSON plain scalar";
              goto LAB_001353e5;
            }
          }
        }
      }
      goto LAB_001352d1;
    }
    _drc_1.type = FYET_DEBUG;
    _drc_1.module = FYEM_UNKNOWN;
    _drc_1.fyt = (fy_token *)0x0;
    _drc_1.has_override = false;
    _drc_1._17_7_ = 0;
    _drc_1.override_file = (char *)0x0;
    auStack_108._0_4_ = FYET_ERROR;
    auStack_108._4_4_ = FYEM_SCAN;
    pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&last_mark.line,(fy_mark *)end_mark,
                               (fy_atom *)local_148);
    _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar15 = "Multi line plain scalars not supported in JSON mode";
LAB_001353e5:
    fydrc = (fy_diag_report_ctx *)auStack_108;
LAB_0013475c:
    fy_parser_diag_report(fyp,fydrc,pcVar15);
    return -1;
  }
LAB_001352d1:
  apcStack_118[1] = (char *)0x1352e6;
  fyt = fy_token_queue(fyp,FYTT_SCALAR,&last_mark.line,0);
  if (fyt == (fy_token *)0x0) {
    pcVar15 = "fy_token_queue() failed";
    iVar5 = 0xd7f;
    goto LAB_001354ff;
  }
  if ((((int)fVar2 < (int)uVar3) && (fyp->flow_level == 0)) && (iVar5 < 0)) {
    apcStack_118[1] = (char *)0x13531c;
    iVar5 = fy_parse_peek_at(fyp,0);
    bVar16 = iVar5 == 0x3a;
    if (-1 < iVar5 && !bVar16) {
      apcStack_118[1] = (char *)0x13533c;
      _Var4 = fyp_is_lb(fyp,iVar5);
      if (!_Var4) {
        iVar7 = 1;
        while ((iVar5 == 0x20 || (iVar5 == 9))) {
          apcStack_118[1] = (char *)0x13535d;
          iVar5 = fy_parse_peek_at(fyp,iVar7);
          bVar16 = iVar5 == 0x3a;
          if ((iVar5 < 0) || (iVar5 == 0x3a)) break;
          apcStack_118[1] = (char *)0x13537b;
          _Var4 = fyp_is_lb(fyp,iVar5);
          iVar7 = iVar7 + 1;
          if (_Var4) break;
        }
      }
    }
    if (bVar16) {
      _drc_1.type = FYET_DEBUG;
      _drc_1.module = FYEM_UNKNOWN;
      _drc_1.fyt = (fy_token *)0x0;
      _drc_1.has_override = false;
      _drc_1._17_7_ = 0;
      _drc_1.override_file = (char *)0x0;
      auStack_108._0_4_ = FYET_ERROR;
      auStack_108._4_4_ = FYEM_SCAN;
      pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&last_mark.line,(fy_mark *)end_mark,
                                 (fy_atom *)local_148);
      _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar15 = "invalid multiline plain key";
      goto LAB_001353e5;
    }
  }
  apcStack_118[1] = (char *)0x135407;
  iVar5 = fy_save_simple_key_mark
                    (fyp,(fy_simple_key_mark *)auStack_d8,FYTT_SCALAR,(fy_mark *)end_mark);
  if (iVar5 != 0) {
    apcStack_118[1] = (char *)0x135437;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0xd96,"fy_fetch_plain_scalar","fy_save_simple_key_mark() failed");
    return iVar5;
  }
  *(ushort *)&fyp->field_0x70 =
       (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 | (ushort)(byte)(bVar11 << 3);
  apcStack_118[0] = "true";
  if (!bVar11) {
    apcStack_118[0] = "false";
  }
  local_148._40_8_ = (fy_input *)0x1354c5;
  fy_parser_diag(fyp,0x20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,0xd99,"fy_fetch_plain_scalar","simple_key_allowed -> %s\n");
  apcStack_118[1] = (char *)0x1354d5;
  iVar5 = fy_attach_comments_if_any(fyp,fyt);
  if (iVar5 == 0) {
    return 0;
  }
  pcVar15 = "fy_attach_right_hand_comment() failed";
  iVar5 = 0xd9d;
LAB_001354ff:
  apcStack_118[1] = (char *)0x135506;
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,iVar5,"fy_fetch_plain_scalar",pcVar15);
  return -1;
LAB_00134ce9:
  if (local_4c != 0) {
    local_a0 = fyp->current_ptr;
    if (fyp == (fy_parser *)0x0) {
      auStack_98 = (undefined1  [8])0x0;
      last_mark.input_pos = 0;
    }
    else {
      auStack_98 = (undefined1  [8])fyp->current_input_pos;
      last_mark.input_pos._0_4_ = fyp->line;
      last_mark.input_pos._4_4_ = fyp->column;
    }
  }
  if (((c_00 != 9) && (c_00 != 0x20)) &&
     ((fyp == (fy_parser *)0x0 ||
      (((c_00 != 10 && (c_00 != 0xd)) &&
       (((fyp->current_input != (fy_input *)0x0 && ((fyp->current_input->field_0x74 & 1) != 0)) ||
        ((1 < c_00 - 0x2028U && (c_00 != 0x85)))))))))) goto LAB_00135026;
  iVar5 = 0;
  iVar13 = 0;
  iVar6 = c_00;
  do {
    apcStack_118[1] = (char *)0x134e52;
    fy_advance(fyp,iVar6);
    if ((((iVar6 == 9) && (fyp->tabsize == 0)) && (bVar16)) && (fyp->column <= iVar7)) {
      fydrc = (fy_diag_report_ctx *)auStack_108;
      _drc_1.type = FYET_DEBUG;
      _drc_1.module = FYEM_UNKNOWN;
      _drc_1.fyt = (fy_token *)0x0;
      _drc_1.has_override = false;
      _drc_1._17_7_ = 0;
      _drc_1.override_file = (char *)0x0;
      auStack_108._0_4_ = FYET_ERROR;
      auStack_108._4_4_ = FYEM_SCAN;
      pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
      _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar15 = "invalid tab used as indentation";
      goto LAB_0013475c;
    }
    apcStack_118[1] = (char *)0x134e7a;
    c_00 = fy_parse_peek_at_offset(fyp,0);
    if ((fyp == (fy_parser *)0x0) ||
       (((iVar6 != 10 && (iVar6 != 0xd)) &&
        (((fyp->current_input != (fy_input *)0x0 && ((fyp->current_input->field_0x74 & 1) != 0)) ||
         ((1 < iVar6 - 0x2028U && (iVar6 != 0x85)))))))) {
      iVar5 = iVar5 + 1;
    }
    else {
      if (!bVar16) {
        bVar16 = true;
      }
      iVar13 = iVar13 + 1;
      iVar5 = 0;
      bVar11 = true;
    }
    iVar6 = c_00;
  } while (((c_00 == 9) || (c_00 == 0x20)) ||
          ((fyp != (fy_parser *)0x0 &&
           (((c_00 == 10 || (c_00 == 0xd)) ||
            (((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0))
             && ((c_00 - 0x2028U < 2 || (c_00 == 0x85))))))))));
  if ((fyp->flow_level == 0) && (fyp->column <= iVar7)) goto LAB_00135026;
  goto LAB_00134a7b;
}

Assistant:

int fy_fetch_plain_scalar(struct fy_parser *fyp, int c) {
    struct fy_atom handle;
    size_t length;
    int rc = -1, indent, run, nextc, i, breaks_found, blanks_found;
    bool has_leading_blanks, had_breaks;
    const char *last_ptr;
    struct fy_mark mark, last_mark;
    bool target_simple_key_allowed, is_multiline, is_complex, has_lb, has_ws;
    bool is_json_unesc, has_json_esc;
    struct fy_simple_key_mark skm;
    struct fy_token *fyt;
#ifdef ATOM_SIZE_CHECK
    size_t tlength;
#endif

    /* may not start with blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !(fyp->state == FYPS_BLOCK_MAPPING_VALUE && fy_is_tab(c)), err_out,
                          "invalid tab as indendation in a mapping");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_is_blankz(fyp, c), err_out,
                          "plain scalar cannot start with blank or zero");

    /* may not start with any of ,[]{}#&*!|>'\"%@` */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fy_utf8_strchr(",[]{}#&*!|>'\"%@`", c), err_out,
                          "plain scalar cannot start with '%c'", c);

    /* may not start with - not followed by blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          c != '-' || !fy_is_blank_at_offset(fyp, 1), err_out,
                          "plain scalar cannot start with '%c' followed by blank", c);

    /* may not start with -?: not followed by blankz (in block context) */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          fyp->flow_level ||
                          !((c == '?' || c == ':') &&
                            fy_is_blank_at_offset(fyp, 1)), err_out,
                          "plain scalar cannot start with '%c' followed by blank (in block context)", c);

    /* check indentation */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented flow %s",
                          fyp->flow == FYFT_SEQUENCE ? "sequence" : "mapping");

    fy_get_mark(fyp, &mark);
    target_simple_key_allowed = false;
    fy_get_simple_key_mark(fyp, &skm);

    fy_fill_atom_start(fyp, &handle);

    has_leading_blanks = false;
    had_breaks = false;
    has_lb = false;
    has_ws = false;
    has_json_esc = false;

    length = 0;
    breaks_found = 0;
    blanks_found = 0;
    indent = fyp->indent + 1;
    last_ptr = NULL;
    memset(&last_mark, 0, sizeof(last_mark));
    c = FYUG_EOF;
    for (;;) {
        /* break for document indicators */
        if (fyp->column == 0 &&
            (!fy_parse_strncmp(fyp, "---", 3) ||
             !fy_parse_strncmp(fyp, "...", 3)) &&
            fy_is_blankz_at_offset(fyp, 3))
            break;

        c = fy_parse_peek(fyp);
        if (c == '#')
            break;

        run = 0;
        for (;;) {
            if (fyp_is_blankz(fyp, c))
                break;

            nextc = fy_parse_peek_at(fyp, 1);

            /* ':' followed by space terminates */
            if (c == ':' && fyp_is_blankz(fyp, nextc))
                break;

            /* in flow context ':' followed by flow markers */
            if (fyp->flow_level && c == ':' && fy_utf8_strchr(",[]{}", nextc))
                break;

            /* in flow context any or , [ ] { } */
            if (fyp->flow_level && (c == ',' || c == '[' || c == ']' || c == '{' || c == '}'))
                break;

            if (breaks_found) {
                /* minimum 1 sep, or more for consecutive */
                length += breaks_found > 1 ? (breaks_found - 1) : 1;
                breaks_found = 0;
                blanks_found = 0;
            } else if (blanks_found) {
                /* just the blanks mam' */
                length += blanks_found;
                blanks_found = 0;
            }

            /* check whether we have a JSON unescaped character */
            is_json_unesc = fy_is_json_unescaped(c);
            if (!is_json_unesc)
                has_json_esc = true;

            fy_advance(fyp, c);
            run++;

            length += fy_utf8_width(c);

            c = nextc;
        }

        /* save end mark if we processed more than one non-blank */
        if (run > 0) {
            /* fyp_scan_debug(fyp, "saving mark"); */
            last_ptr = fyp->current_ptr;
            fy_get_mark(fyp, &last_mark);
        }

        /* end? */
        if (!(fy_is_blank(c) || fyp_is_lb(fyp, c)))
            break;

        has_json_esc = true;

        /* consume blanks */
        breaks_found = 0;
        blanks_found = 0;
        do {
            fy_advance(fyp, c);

            if (!fyp->tabsize) {
                /* check for tab */
                FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                                      c != '\t' || !has_leading_blanks || fyp->column >= indent, err_out,
                                      "invalid tab used as indentation");
            }

            nextc = fy_parse_peek(fyp);

            /* if it's a break */
            if (fyp_is_lb(fyp, c)) {
                /* first break, turn on leading blanks */
                if (!has_leading_blanks)
                    has_leading_blanks = true;
                had_breaks = true;
                breaks_found++;
                blanks_found = 0;
                has_lb = true;
            } else {
                blanks_found++;
                has_ws = true;
            }

            c = nextc;

        } while (fy_is_blank(c) || fyp_is_lb(fyp, c));

        /* break out if indentation is less */
        if (!fyp->flow_level && fyp->column < indent)
            break;
    }

    /* end... */
    if (!last_ptr)
        fy_fill_atom_end(fyp, &handle);
    else
        fy_fill_atom_end_at(fyp, &handle, &last_mark);

    if (c == FYUG_INV || c == FYUG_PARTIAL) {
        FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                       "plain scalar is malformed UTF8");
        goto err_out;
    }

    is_multiline = handle.end_mark.line > handle.start_mark.line;
    is_complex = fyp->pending_complex_key_column >= 0;

    handle.style = FYAS_PLAIN;
    handle.chomp = FYAC_STRIP;
    handle.direct_output = !is_multiline && !has_json_esc && fy_atom_size(&handle) == length;
    handle.empty = false;
    handle.has_lb = has_lb;
    handle.has_ws = has_ws;
    handle.starts_with_ws = false;
    handle.starts_with_lb = false;
    handle.ends_with_ws = false;
    handle.ends_with_lb = false;
    handle.trailing_lb = false;
    handle.size0 = length == 0;
    handle.valid_anchor = false;
    handle.tabsize = fyp->tabsize;

#ifdef ATOM_SIZE_CHECK
    tlength = fy_atom_format_text_length(&handle);
    fyp_error_check(fyp,
                    tlength == length,
                    err_out, "storage hint calculation failed real %zu != hint %zu - '%s'",
                    tlength, length,
                    fy_utf8_format_text_a(fy_atom_data(&handle), fy_atom_size(&handle), fyue_singlequote));
#endif

    handle.storage_hint = length;
    handle.storage_hint_valid = true;

    /* extra check in json mode */
    if (fyp_json_mode(fyp)) {
        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !is_multiline, err_out,
                             "Multi line plain scalars not supported in JSON mode");

        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !fy_atom_strcmp(&handle, "false") ||
                             !fy_atom_strcmp(&handle, "true") ||
                             !fy_atom_strcmp(&handle, "null") ||
                             fy_atom_is_number(&handle), err_out,
                             "Invalid JSON plain scalar");
    }

    /* and we're done */
    fyt = fy_token_queue(fyp, FYTT_SCALAR, &handle, FYSS_PLAIN);
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    if (is_multiline && !fyp->flow_level && !is_complex) {
        /* due to the weirdness with simple keys scan forward
		* until a linebreak, ';', or anything else */
        for (i = 0;; i++) {
            c = fy_parse_peek_at(fyp, i);
            if (c < 0 || c == ':' || fyp_is_lb(fyp, c) || !fy_is_ws(c))
                break;
        }

        /* if we're a key, that's invalid */
        if (c == ':') {
            FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                           "invalid multiline plain key");
            goto err_out;
        }
    }

    target_simple_key_allowed = had_breaks;

    rc = fy_save_simple_key_mark(fyp, &skm, FYTT_SCALAR, &handle.end_mark);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_save_simple_key_mark() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    rc = fy_attach_comments_if_any(fyp, fyt);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_attach_right_hand_comment() failed");

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}